

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void getPU(double *A,int M,int N,int *ipiv,double *P,double *U)

{
  int iVar1;
  void *__ptr;
  ulong uVar2;
  long lVar3;
  void *__ptr_00;
  ulong uVar4;
  void *pvVar5;
  ulong uVar6;
  int iVar7;
  double *pdVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  
  lVar12 = (long)M;
  __ptr = malloc(lVar12 * 4);
  uVar2 = 0;
  uVar4 = 0;
  if (0 < M) {
    uVar4 = (ulong)(uint)M;
  }
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    *(int *)((long)__ptr + (long)ipiv[uVar2] * 4) = (int)uVar2;
  }
  iVar1 = N;
  if (M < N) {
    iVar1 = M;
  }
  lVar3 = (long)iVar1;
  __ptr_00 = malloc(lVar12 * lVar3 * 8);
  iVar1 = M - N;
  if (iVar1 == 0) {
    if (__ptr_00 != (void *)0x0) {
      iVar1 = 1;
      pvVar5 = __ptr_00;
      pdVar8 = A;
      for (uVar2 = 0; uVar2 != uVar4; uVar2 = uVar2 + 1) {
        lVar9 = (long)iVar1;
        for (uVar11 = 0; uVar2 != uVar11; uVar11 = uVar11 + 1) {
          *(double *)((long)pvVar5 + uVar11 * 8) = pdVar8[uVar11];
        }
        *(undefined8 *)((long)__ptr_00 + uVar2 * 8 + uVar2 * lVar12 * 8) = 0x3ff0000000000000;
        for (; lVar9 < lVar12; lVar9 = lVar9 + 1) {
          *(undefined8 *)((long)pvVar5 + lVar9 * 8) = 0;
        }
        iVar1 = iVar1 + 1;
        pdVar8 = pdVar8 + lVar12;
        pvVar5 = (void *)((long)pvVar5 + lVar12 * 8);
      }
    }
    if (U != (double *)0x0) {
      uVar2 = (ulong)(uint)M;
      pdVar8 = U;
      for (uVar11 = 0; uVar11 != uVar4; uVar11 = uVar11 + 1) {
        for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
          U[uVar6] = 0.0;
        }
        for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
          pdVar8[uVar6] = A[uVar6];
        }
        U = U + lVar12;
        uVar2 = uVar2 - 1;
        A = A + lVar12 + 1;
        pdVar8 = pdVar8 + lVar12 + 1;
      }
    }
  }
  else if (iVar1 == 0 || M < N) {
    if (M < N) {
      if (__ptr_00 != (void *)0x0) {
        iVar1 = 1;
        pdVar8 = A;
        pvVar5 = __ptr_00;
        for (uVar2 = 0; uVar2 != uVar4; uVar2 = uVar2 + 1) {
          lVar9 = (long)iVar1;
          for (uVar11 = 0; uVar2 != uVar11; uVar11 = uVar11 + 1) {
            *(double *)((long)pvVar5 + uVar11 * 8) = pdVar8[uVar11];
          }
          *(undefined8 *)((long)__ptr_00 + uVar2 * 8 + uVar2 * lVar12 * 8) = 0x3ff0000000000000;
          for (; lVar9 < lVar12; lVar9 = lVar9 + 1) {
            *(undefined8 *)((long)pvVar5 + lVar9 * 8) = 0;
          }
          iVar1 = iVar1 + 1;
          pvVar5 = (void *)((long)pvVar5 + lVar12 * 8);
          pdVar8 = pdVar8 + N;
        }
      }
      if (U != (double *)0x0) {
        lVar12 = 0;
        uVar2 = 0;
        pdVar8 = U;
        while( true ) {
          uVar11 = uVar2 & 0xffffffff;
          if ((int)uVar2 < N) {
            uVar11 = (ulong)(uint)N;
          }
          if (uVar2 == uVar4) break;
          for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
            U[uVar6] = 0.0;
          }
          for (lVar9 = 0; uVar11 + lVar12 != lVar9; lVar9 = lVar9 + 1) {
            pdVar8[lVar9] = A[lVar9];
          }
          uVar2 = uVar2 + 1;
          U = U + N;
          lVar12 = lVar12 + -1;
          A = A + (long)N + 1;
          pdVar8 = pdVar8 + (long)N + 1;
        }
      }
    }
  }
  else {
    if (__ptr_00 != (void *)0x0) {
      lVar12 = (long)N;
      uVar2 = 0;
      uVar11 = 0;
      if (0 < N) {
        uVar11 = (ulong)(uint)N;
      }
      iVar7 = 1;
      pvVar5 = __ptr_00;
      pdVar8 = A;
      for (; uVar2 != uVar11; uVar2 = uVar2 + 1) {
        lVar9 = (long)iVar7;
        for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
          *(double *)((long)pvVar5 + uVar6 * 8) = pdVar8[uVar6];
        }
        *(undefined8 *)((long)__ptr_00 + uVar2 * 8 + uVar2 * lVar12 * 8) = 0x3ff0000000000000;
        for (; lVar9 < lVar12; lVar9 = lVar9 + 1) {
          *(undefined8 *)((long)pvVar5 + lVar9 * 8) = 0;
        }
        iVar7 = iVar7 + 1;
        pdVar8 = pdVar8 + lVar12;
        pvVar5 = (void *)((long)pvVar5 + lVar12 * 8);
      }
      memcpy((void *)((ulong)(uint)(N * N) * 8 + (long)__ptr_00),A + (uint)(N * N),
             lVar12 * iVar1 * 8);
    }
    if (U != (double *)0x0) {
      uVar2 = 0;
      uVar11 = 0;
      if (0 < N) {
        uVar11 = (ulong)(uint)N;
      }
      uVar6 = (ulong)(uint)N;
      pdVar8 = U;
      for (; uVar2 != uVar11; uVar2 = uVar2 + 1) {
        for (uVar10 = 0; uVar2 != uVar10; uVar10 = uVar10 + 1) {
          U[uVar10] = 0.0;
        }
        for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
          pdVar8[uVar10] = A[uVar10];
        }
        U = U + N;
        uVar6 = uVar6 - 1;
        A = A + (long)N + 1;
        pdVar8 = pdVar8 + (long)N + 1;
      }
    }
  }
  for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    memcpy(P,(void *)(*(int *)((long)__ptr + uVar2 * 4) * lVar3 * 8 + (long)__ptr_00),lVar3 * 8);
    P = P + lVar3;
  }
  free(__ptr);
  free(__ptr_00);
  return;
}

Assistant:

void getPU(double *A, int M, int N, int *ipiv, double *P,double *U) {
	int i,j,K;
	int *ipivt;
	double *L;

	ipivt = (int*)malloc(sizeof(int)*M);

	for (i = 0; i < M; ++i) {
		ipivt[ipiv[i]] = i;
	}

	if (M > N) {
		K = N;
	}
	else {
		K = M;
	}

	L = (double*)malloc(sizeof(double)*M*K);

	if (M == N) {
		if (L) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					L[i*M + j] = A[i*M + j];
				}
				L[i*M + i] = 1.0;
				for (j = i + 1; j < M; ++j) {
					L[i*M + j] = 0.0;
				}
			}
		}
		if (U) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					U[i*M + j] = 0.0;
				}
				for (j = i; j < M; ++j) {
					U[i*M + j] = A[i*M + j];
				}
			}
		}
	}
	else if (M > N) {
		if (L) {
			for (i = 0; i < N; ++i) {
				for (j = 0; j < i; ++j) {
					L[i*N + j] = A[i*N + j];
				}
				L[i*N + i] = 1.0;
				for (j = i + 1; j < N; ++j) {
					L[i*N + j] = 0.0;
				}
			}
			memcpy(L + N*N, A + N*N, sizeof(double)*(M - N)*N);
		}
		if (U) {
			for (i = 0; i < N; ++i) {
				for (j = 0; j < i; ++j) {
					U[i*N + j] = 0.0;
				}
				for (j = i; j < N; ++j) {
					U[i*N + j] = A[i*N + j];
				}
			}
		}
	}
	else if (M < N) {
		if (L) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					L[i*M + j] = A[i*N + j];
				}
				L[i*M + i] = 1.0;
				for (j = i + 1; j < M; ++j) {
					L[i*M + j] = 0.0;
				}
			}
		}

		if (U) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					U[i*N + j] = 0.0;
				}
				for (j = i; j < N; ++j) {
					U[i*N + j] = A[i*N + j];
				}
			}
		}
	}

	for (i = 0; i < M; ++i) {
		memcpy(P + i*K, L + ipivt[i] * K, sizeof(double)*K);
	}


	free(ipivt);
	free(L);
}